

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O2

void __thiscall
tcu::Exception::Exception(Exception *this,char *message,char *expr,char *file,int line)

{
  char *__s;
  undefined4 in_register_00000084;
  int in_R9D;
  string sStack_38;
  
  formatError_abi_cxx11_
            (&sStack_38,(tcu *)message,expr,file,(char *)CONCAT44(in_register_00000084,line),in_R9D)
  ;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)this = &PTR__Exception_0027cf98;
  __s = "Runtime check failed";
  if (message != (char *)0x0) {
    __s = message;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_message,__s,(allocator<char> *)&sStack_38);
  return;
}

Assistant:

Exception::Exception (const char* message, const char* expr, const char* file, int line)
	: std::runtime_error(formatError(message, expr, file, line))
	, m_message			(message ? message : "Runtime check failed")
{
}